

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

JsValueRef
Debugger::SetBreakOnException
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  ulong uVar4;
  char16_t *format;
  JsRuntimeHandle pvVar5;
  JsValueRef local_28;
  JsValueRef breakOnException;
  int exceptionAttributes;
  
  if (1 < argumentCount) {
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtConvertValueToNumber)(arguments[1],&local_28);
    if (JVar1 == JsNoError) {
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                        (local_28,(int *)((long)&breakOnException + 4));
      if (JVar1 == JsNoError) {
        if (debugger == (Debugger *)0x0) {
          pvVar5 = (JsRuntimeHandle)0x0;
        }
        else {
          pvVar5 = debugger->m_runtime;
        }
        JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagSetBreakOnException)
                          (pvVar5,breakOnException._4_4_);
        if (JVar1 == JsNoError) {
          return (JsValueRef)0x0;
        }
        uVar4 = (ulong)JVar1;
        pPVar2 = PAL_get_stderr(0);
        pWVar3 = Helpers::JsErrorCodeToString(JVar1);
        format = 
        L"ERROR: ChakraRTInterface::JsDiagSetBreakOnException(Debugger::GetRuntime(), (JsDiagBreakOnExceptionAttributes)exceptionAttributes) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
      else {
        uVar4 = (ulong)JVar1;
        pPVar2 = PAL_get_stderr(0);
        pWVar3 = Helpers::JsErrorCodeToString(JVar1);
        format = 
        L"ERROR: ChakraRTInterface::JsNumberToInt(breakOnException, &exceptionAttributes) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      uVar4 = (ulong)JVar1;
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      format = 
      L"ERROR: ChakraRTInterface::JsConvertValueToNumber(arguments[1], &breakOnException) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar2,format,uVar4,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef Debugger::SetBreakOnException(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    int exceptionAttributes;

    if (argumentCount > 1)
    {
        JsValueRef breakOnException;
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsConvertValueToNumber(arguments[1], &breakOnException));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(breakOnException, &exceptionAttributes));

        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagSetBreakOnException(Debugger::GetRuntime(), (JsDiagBreakOnExceptionAttributes)exceptionAttributes));
    }

    return JS_INVALID_REFERENCE;
}